

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

int __thiscall jbcoin::Serializer::addEncoded(Serializer *this,int length)

{
  int iVar1;
  array<unsigned_char,_4UL> bytes;
  
  if (length < 0xc1) {
    iVar1 = 1;
  }
  else if ((uint)length < 0x30c1) {
    iVar1 = 2;
  }
  else {
    if (0xe04d8 < (uint)length) {
      Throw<std::overflow_error,char_const(&)[7]>((char (*) [7])"lenlen");
    }
    iVar1 = 3;
  }
  iVar1 = addRaw(this,&bytes,iVar1);
  return iVar1;
}

Assistant:

int Serializer::addEncoded (int length)
{
    std::array<std::uint8_t, 4> bytes;
    int numBytes = 0;

    if (length <= 192)
    {
        bytes[0] = static_cast<unsigned char> (length);
        numBytes = 1;
    }
    else if (length <= 12480)
    {
        length -= 193;
        bytes[0] = 193 + static_cast<unsigned char> (length >> 8);
        bytes[1] = static_cast<unsigned char> (length & 0xff);
        numBytes = 2;
    }
    else if (length <= 918744)
    {
        length -= 12481;
        bytes[0] = 241 + static_cast<unsigned char> (length >> 16);
        bytes[1] = static_cast<unsigned char> ((length >> 8) & 0xff);
        bytes[2] = static_cast<unsigned char> (length & 0xff);
        numBytes = 3;
    }
    else Throw<std::overflow_error> ("lenlen");

    return addRaw (&bytes[0], numBytes);
}